

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

bool __thiscall
ICM::Compiler::PreliminaryCompile::adjustNode(PreliminaryCompile *this,Node *node,size_t begin)

{
  bool bVar1;
  iterator b;
  reference elt;
  Element *e;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  __end2;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  __begin2;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  local_48;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  local_40;
  RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
  local_38;
  RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
  *local_28;
  RangeIterator<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
  *__range2;
  size_t begin_local;
  Node *node_local;
  PreliminaryCompile *this_local;
  
  __range2 = (RangeIterator<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
              *)begin;
  begin_local = (size_t)node;
  node_local = (Node *)this;
  local_48._M_current =
       (Element *)
       std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::begin
                 (&node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                 );
  local_40 = __gnu_cxx::
             __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
             ::operator+(&local_48,(difference_type)__range2);
  b = std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::end
                ((vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_> *)
                 begin_local);
  local_38 = (RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
              )Common::
               rangei<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element*,std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>>>
                         (local_40,(__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
                                    )b._M_current);
  local_28 = &local_38;
  __end2 = Common::
           RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
           ::begin(local_28);
  e = (Element *)
      Common::
      RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
      ::end(local_28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
                                *)&e);
    if (!bVar1) break;
    elt = __gnu_cxx::
          __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
          ::operator*(&__end2);
    adjustElement(this,elt);
    __gnu_cxx::
    __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
    ::operator++(&__end2);
  }
  return true;
}

Assistant:

bool adjustNode(Node &node, size_t begin = 0) {
				for (Element &e : rangei(node.begin() + begin, node.end())) {
					adjustElement(e);
				}
				return true;
			}